

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::read_piece(torrent *this,piece_index_t piece)

{
  vector<aux::file_entry,_file_index_t> *this_00;
  pointer *pppVar1;
  int *piVar2;
  uint_least32_t *puVar3;
  session_interface *psVar4;
  long lVar5;
  long *plVar6;
  bool *pbVar7;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> sVar8;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> sVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint_least32_t uVar15;
  generic_error_category *pgVar16;
  undefined4 extraout_var;
  char *p;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint uVar18;
  ulong uVar19;
  undefined8 uVar20;
  peer_request r;
  shared_ptr<libtorrent::aux::torrent> self;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [48];
  undefined1 local_98 [36];
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> sStack_74;
  undefined8 uStack_70;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_64;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Head_base<0UL,_libtorrent::aux::hash_picker_*,_false> *local_58;
  pointer pppStack_50;
  code *local_48;
  __uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
  _Stack_40;
  element_type *local_38;
  _func_int **pp_Var17;
  
  local_c8._32_4_ = 0;
  local_c8[0x24] = '\0';
  local_c8._40_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
  local_dc.m_val = piece.m_val;
  if ((((this->super_torrent_hot_members).field_0x4b & 4) == 0) && ((this->field_0x5e0 & 4) == 0)) {
    if ((((this->super_torrent_hot_members).m_torrent_file.
          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files)
        .m_piece_length < 1) {
      pgVar16 = (generic_error_category *)libtorrent_category();
      local_c8._32_4_ = 0x6d;
      if ((((error_category *)pgVar16)->id_ == 0x8fafd21e25c5e09b) ||
         (((error_category *)pgVar16)->id_ == 0xb2ab117a257edf0d)) goto LAB_0030dbc3;
      pp_Var17 = ((error_category *)pgVar16)->_vptr_error_category;
      uVar20 = 0x6d;
LAB_0030dc8c:
      iVar11 = (*pp_Var17[6])(pgVar16,uVar20);
      local_c8[0x24] = (char)iVar11;
      local_c8._40_8_ = pgVar16;
      if (local_c8[0x24] != '\0') goto LAB_0030dbcd;
    }
    else {
      bVar10 = has_piece_passed(this,piece);
      if (!bVar10) {
        pgVar16 = (generic_error_category *)libtorrent_category();
        local_c8._32_4_ = 0x8d;
        if ((((error_category *)pgVar16)->id_ == 0x8fafd21e25c5e09b) ||
           (((error_category *)pgVar16)->id_ == 0xb2ab117a257edf0d)) goto LAB_0030dbc3;
        pp_Var17 = ((error_category *)pgVar16)->_vptr_error_category;
        uVar20 = 0x8d;
        goto LAB_0030dc8c;
      }
    }
    uVar12 = file_storage::piece_size
                       (&((this->super_torrent_hot_members).m_torrent_file.
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_files,piece);
    uVar14 = (((this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_files).m_piece_length;
    uVar18 = 0x4000;
    if (uVar14 < 0x4000) {
      uVar18 = uVar14;
    }
    if ((int)uVar14 < 1) {
      uVar18 = 0x4000;
    }
    lVar5 = (long)(int)(uVar12 + uVar18 + -1);
    uVar19 = lVar5 / (long)(int)uVar18;
    iVar11 = (int)uVar19;
    if (iVar11 == 0) {
      local_c8._0_8_ =
           (__uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
            )0x0;
      local_c8._8_8_ =
           (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
            )0x0;
      psVar4 = (this->super_torrent_hot_members).m_ses;
      iVar11 = (*(psVar4->super_session_logger)._vptr_session_logger[5])
                         (psVar4,(ulong)uVar18,lVar5 % (long)(int)uVar18 & 0xffffffff);
      get_handle((torrent *)local_d8);
      local_98._0_8_ = (ulong)(uint)local_98._4_4_ << 0x20;
      alert_manager::
      emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::shared_array<char>&,int>
                ((alert_manager *)CONCAT44(extraout_var_02,iVar11),(torrent_handle *)local_d8,
                 &local_dc,(shared_array<char> *)local_c8,(int *)local_98);
      plVar6 = (long *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
      if (plVar6 != (long *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar2 = (int *)((long)plVar6 + 0xc);
          iVar11 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
        }
        else {
          iVar11 = *(int *)((long)plVar6 + 0xc);
          *(int *)((long)plVar6 + 0xc) = iVar11 + -1;
        }
        if (iVar11 == 1) {
          (**(code **)(*plVar6 + 0x18))();
        }
      }
      boost::detail::shared_count::~shared_count((shared_count *)(local_c8 + 8));
    }
    else {
      uVar19 = uVar19 & 0xffffffff;
      local_c8._24_8_ = operator_new(0x38);
      *(undefined8 *)&(((element_type *)local_c8._24_8_)->m_files).m_v2 = 0x100000001;
      *(undefined ***)&((element_type *)local_c8._24_8_)->m_files =
           &PTR___Sp_counted_ptr_inplace_004e7750;
      this_00 = &(((element_type *)local_c8._24_8_)->m_files).m_files;
      (((element_type *)local_c8._24_8_)->m_files).m_files.
      super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
      super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (((element_type *)local_c8._24_8_)->m_files).m_files.
      super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
      super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (((element_type *)local_c8._24_8_)->m_files).m_files.
      super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
      super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (((element_type *)local_c8._24_8_)->m_files).m_file_hashes.
      super_vector<const_char_*,_std::allocator<const_char_*>_>.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (((element_type *)local_c8._24_8_)->m_files).m_file_hashes.
      super_vector<const_char_*,_std::allocator<const_char_*>_>.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)&boost::system::detail::cat_holder<void>::system_category_instance;
      p = (char *)operator_new__((long)(int)uVar12,(nothrow_t *)&::std::nothrow);
      boost::shared_array<char>::reset<char>((shared_array<char> *)this_00,p);
      if ((this_00->
          super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>).
          super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        iVar11 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        get_handle((torrent *)local_c8);
        local_98._0_5_ = 0x10000000c;
        local_98._8_8_ = &boost::system::detail::cat_holder<void>::generic_category_instance;
        alert_manager::
        emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code>
                  ((alert_manager *)CONCAT44(extraout_var_03,iVar11),(torrent_handle *)local_c8,
                   &local_dc,(error_code *)local_98);
        if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )local_c8._8_8_ !=
            (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            puVar3 = (uint_least32_t *)(local_c8._8_8_ + 0xc);
            uVar15 = *puVar3;
            *puVar3 = *puVar3 - 1;
            UNLOCK();
          }
          else {
            uVar15 = *(uint_least32_t *)(local_c8._8_8_ + 0xc);
            *(uint_least32_t *)(local_c8._8_8_ + 0xc) = uVar15 - 1;
          }
          if (uVar15 == 1) {
            (*(*(_func_int ***)(file_storage *)local_c8._8_8_)[3])();
          }
        }
      }
      else {
        *(int *)&(((file_storage *)local_c8._24_8_)->m_files).
                 super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                 .
                 super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage = iVar11;
        *(undefined1 *)
         ((long)&(((file_storage *)local_c8._24_8_)->m_files).
                 super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                 .
                 super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
        iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        local_98._0_8_ = CONCAT44(extraout_var_00,iVar13) + 0x438;
        local_98._8_8_ = local_98._8_8_ & 0xffffffffffffff00;
        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_98);
        local_98[8] = 1;
        iVar13 = *(int *)(CONCAT44(extraout_var_00,iVar13) + 0x23c);
        local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
        local_38 = (element_type *)(ulong)uVar12;
        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_98);
        local_d8._0_4_ = local_dc.m_val;
        local_d8._4_4_ = 0;
        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::torrent,void>
                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_c8,
                   (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
        if (0 < iVar11) {
          uVar14 = (((this->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->m_files).m_piece_length;
          local_64.m_val = (uint)(byte)((iVar13 == 2) << 4);
          do {
            uVar18 = (int)local_38 - local_d8._4_4_;
            local_d8._8_4_ = 0x4000;
            if (uVar14 < 0x4000) {
              local_d8._8_4_ = uVar14;
            }
            if ((int)uVar14 < 1) {
              local_d8._8_4_ = 0x4000;
            }
            if ((int)uVar18 <= (int)local_d8._8_4_) {
              local_d8._8_4_ = uVar18;
            }
            iVar11 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[4])();
            uVar14 = (this->m_storage).m_idx.m_val;
            local_98._0_8_ = local_c8._0_8_;
            local_98._8_8_ = local_c8._8_8_;
            if ((piece_picker *)local_c8._8_8_ == (piece_picker *)0x0) {
LAB_0030de86:
              if (__libc_single_threaded != '\0') goto LAB_0030deb0;
              LOCK();
              pbVar7 = &((file_storage *)local_c8._24_8_)->m_v2;
              *(int *)pbVar7 = *(int *)pbVar7 + 1;
              UNLOCK();
            }
            else {
              if (__libc_single_threaded == '\0') {
                LOCK();
                pppVar1 = &(((vector<piece_pos,_piece_index_t> *)local_c8._8_8_)->
                           super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                           ).
                           super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *(int *)pppVar1 = *(int *)pppVar1 + 1;
                UNLOCK();
                goto LAB_0030de86;
              }
              pppVar1 = &(((vector<piece_pos,_piece_index_t> *)local_c8._8_8_)->
                         super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                         ).
                         super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *(int *)pppVar1 = *(int *)pppVar1 + 1;
LAB_0030deb0:
              pbVar7 = &((file_storage *)local_c8._24_8_)->m_v2;
              *(int *)pbVar7 = *(int *)pbVar7 + 1;
            }
            local_98._20_4_ = local_d8._4_4_;
            local_98._16_4_ = local_d8._0_4_;
            uStack_70 = (peer_list *)local_c8._24_8_;
            stack0xffffffffffffff88 = local_60;
            local_98._24_4_ = local_d8._8_4_;
            local_48 = (code *)0x0;
            _Stack_40._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
            .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl =
                 (tuple<libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                  )(_Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                    )0x0;
            local_58 = (_Head_base<0UL,_libtorrent::aux::hash_picker_*,_false> *)0x0;
            pppStack_50 = (pointer)0x0;
            local_58 = (_Head_base<0UL,_libtorrent::aux::hash_picker_*,_false> *)operator_new(0x30);
            uVar20 = local_98._8_8_;
            local_98._8_8_ = (piece_picker *)0x0;
            local_58->_M_head_impl = (hash_picker *)local_98._0_8_;
            local_58[1]._M_head_impl = (hash_picker *)uVar20;
            local_98._0_8_ = (_func_int **)0x0;
            *(undefined4 *)&local_58[3]._M_head_impl = local_98._24_4_;
            local_58[2]._M_head_impl = (hash_picker *)local_98._16_8_;
            sVar8.m_val = uStack_70._0_4_;
            sVar9.m_val = uStack_70._4_4_;
            uStack_70 = (peer_list *)0x0;
            *(undefined4 *)&local_58[4]._M_head_impl = local_98._32_4_;
            *(uint *)((long)&local_58[4]._M_head_impl + 4) = sStack_74.m_val;
            *(uint *)&local_58[5]._M_head_impl = sVar8.m_val;
            *(uint *)((long)&local_58[5]._M_head_impl + 4) = sVar9.m_val;
            stack0xffffffffffffff88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            _Stack_40._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
            .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl =
                 (tuple<libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                  )::std::
                   _Function_handler<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:779:7)>
                   ::_M_invoke;
            local_48 = ::std::
                       _Function_handler<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:779:7)>
                       ::_M_manager;
            (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar11) + 0x10))
                      ((long *)CONCAT44(extraout_var_01,iVar11),uVar14,local_d8,&local_58,
                       local_64.m_val);
            if (local_48 != (code *)0x0) {
              (*local_48)(&local_58,&local_58,3);
            }
            uVar14 = (((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files).m_piece_length;
            uVar18 = 0x4000;
            if (uVar14 < 0x4000) {
              uVar18 = uVar14;
            }
            if ((int)uVar14 < 1) {
              uVar18 = 0x4000;
            }
            local_d8._4_4_ = uVar18 + local_d8._4_4_;
            uVar18 = (int)uVar19 - 1;
            uVar19 = (ulong)uVar18;
          } while (uVar18 != 0);
        }
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x1f])();
        if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )local_c8._8_8_ !=
            (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        }
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._24_8_);
    }
  }
  else {
    local_c8._32_4_ = 0x7d;
    pgVar16 = &boost::system::detail::cat_holder<void>::generic_category_instance;
LAB_0030dbc3:
    local_c8[0x24] = '\x01';
    local_c8._40_8_ = pgVar16;
LAB_0030dbcd:
    iVar11 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)local_98);
    alert_manager::
    emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code&>
              ((alert_manager *)CONCAT44(extraout_var,iVar11),(torrent_handle *)local_98,&local_dc,
               (error_code *)(local_c8 + 0x20));
    if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
         )local_98._8_8_ !=
        (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
         )0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar2 = (int *)(local_98._8_8_ + 0xc);
        iVar11 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
      }
      else {
        iVar11 = *(int *)(local_98._8_8_ + 0xc);
        *(int *)(local_98._8_8_ + 0xc) = iVar11 + -1;
      }
      if (iVar11 == 1) {
        (**(code **)(*(long *)local_98._8_8_ + 0x18))();
      }
    }
  }
  return;
}

Assistant:

void torrent::read_piece(piece_index_t const piece)
	{
		error_code ec;
		if (m_abort || m_deleted)
		{
			ec.assign(boost::system::errc::operation_canceled, generic_category());
		}
		else if (!valid_metadata())
		{
			ec.assign(errors::no_metadata, libtorrent_category());
		}
		else if (!has_piece_passed(piece))
		{
			ec.assign(errors::invalid_piece_index, libtorrent_category());
		}

		if (ec)
		{
			m_ses.alerts().emplace_alert<read_piece_alert>(get_handle(), piece, ec);
			return;
		}

		const int piece_size = m_torrent_file->piece_size(piece);
		const int blocks_in_piece = (piece_size + block_size() - 1) / block_size();

		TORRENT_ASSERT(blocks_in_piece > 0);
		TORRENT_ASSERT(piece_size > 0);

		if (blocks_in_piece == 0)
		{
			// this shouldn't actually happen
			boost::shared_array<char> buf;
			m_ses.alerts().emplace_alert<read_piece_alert>(
				get_handle(), piece, buf, 0);
			return;
		}

		std::shared_ptr<read_piece_struct> rp = std::make_shared<read_piece_struct>();
		rp->piece_data.reset(new (std::nothrow) char[std::size_t(piece_size)]);
		if (!rp->piece_data)
		{
			m_ses.alerts().emplace_alert<read_piece_alert>(
				get_handle(), piece, error_code(boost::system::errc::not_enough_memory, generic_category()));
			return;
		}
		rp->blocks_left = blocks_in_piece;
		rp->fail = false;

		disk_job_flags_t flags{};
		auto const read_mode = settings().get_int(settings_pack::disk_io_read_mode);
		if (read_mode == settings_pack::disable_os_cache)
			flags |= disk_interface::volatile_read;

		peer_request r;
		r.piece = piece;
		r.start = 0;
		auto self = shared_from_this();
		for (int i = 0; i < blocks_in_piece; ++i, r.start += block_size())
		{
			r.length = std::min(piece_size - r.start, block_size());
			m_ses.disk_thread().async_read(m_storage, r
				, [self, r, rp](disk_buffer_holder block, storage_error const& se) mutable
				{ self->on_disk_read_complete(std::move(block), se, r, rp); }
				, flags);
		}
		m_ses.deferred_submit_jobs();
	}